

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball_view.cpp
# Opt level: O0

void __thiscall lumeview::ArcBallView::set_viewport(ArcBallView *this,ivec4 *vp)

{
  ostream *os;
  LumeviewError *this_00;
  vec2 local_1e4;
  vec2 local_1dc;
  undefined1 local_1d1;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  ivec4 *local_18;
  ivec4 *vp_local;
  ArcBallView *this_local;
  
  local_18 = vp;
  vp_local = (ivec4 *)this;
  WindowEventListener::set_viewport(&this->super_WindowEventListener,vp);
  if (((local_18->field_0).field_0.x != (local_18->field_0).field_0.z) &&
     ((local_18->field_0).field_0.y != (local_18->field_0).field_0.w)) {
    glm::tvec2<float,(glm::precision)0>::tvec2<int,int>
              ((tvec2<float,(glm::precision)0> *)&local_1dc,
               (local_18->field_0).field_0.z - (local_18->field_0).field_0.x,
               (local_18->field_0).field_0.w - (local_18->field_0).field_0.y);
    ArcBall::set_frame(&this->m_arcBall,&local_1dc);
    glm::tvec2<float,(glm::precision)0>::tvec2<int,int>
              ((tvec2<float,(glm::precision)0> *)&local_1e4,(local_18->field_0).field_0.x,
               (local_18->field_0).field_0.y);
    ArcBall::set_offset(&this->m_arcBall,&local_1e4);
    View::set_viewport(&this->m_view,local_18);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  os = std::operator<<(local_190,"Bad viewport spefified: ");
  glm::operator<<(os,local_18);
  local_1d1 = 1;
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringstream::str();
  LumeviewError::LumeviewError(this_00,local_1d0);
  local_1d1 = 0;
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

void ArcBallView::set_viewport (const glm::ivec4& vp)
{
	base_t::set_viewport (vp);
    COND_THROW((vp.x == vp.z) || (vp.y == vp.w),
               "Bad viewport spefified: " << vp);
    m_arcBall.set_frame (glm::vec2(vp.z - vp.x, vp.w - vp.y));
    m_arcBall.set_offset (glm::vec2(vp.x, vp.y));
    m_view.set_viewport (vp);
}